

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O2

void nn_sws_init(nn_sws *self,int src,nn_ep *ep,nn_fsm *owner)

{
  nn_fsm_init(&self->fsm,nn_sws_handler,nn_sws_shutdown,src,self,owner);
  self->state = 1;
  nn_ws_handshake_init(&self->handshaker,2,&self->fsm);
  self->usock = (nn_usock *)0x0;
  (self->usock_owner).src = -1;
  (self->usock_owner).fsm = (nn_fsm *)0x0;
  nn_pipebase_init(&self->pipebase,&nn_sws_pipebase_vfptr,ep);
  self->instate = -1;
  nn_list_init(&self->inmsg_array);
  self->outstate = -1;
  nn_msg_init(&self->outmsg,0);
  self->pings_sent = 0;
  self->pongs_sent = 0;
  self->pings_received = 0;
  self->pongs_received = 0;
  self->continuing = 0;
  self->utf8_code_pt_fragment[0] = '\0';
  self->utf8_code_pt_fragment[1] = '\0';
  self->utf8_code_pt_fragment[2] = '\0';
  self->utf8_code_pt_fragment[3] = '\0';
  self->utf8_code_pt_fragment_len = 0;
  nn_fsm_event_init(&self->done);
  return;
}

Assistant:

void nn_sws_init (struct nn_sws *self, int src,
    struct nn_ep *ep, struct nn_fsm *owner)
{
    nn_fsm_init (&self->fsm, nn_sws_handler, nn_sws_shutdown,
        src, self, owner);
    self->state = NN_SWS_STATE_IDLE;
    nn_ws_handshake_init (&self->handshaker,
        NN_SWS_SRC_HANDSHAKE, &self->fsm);
    self->usock = NULL;
    self->usock_owner.src = -1;
    self->usock_owner.fsm = NULL;
    nn_pipebase_init (&self->pipebase, &nn_sws_pipebase_vfptr, ep);
    self->instate = -1;
    nn_list_init (&self->inmsg_array);
    self->outstate = -1;
    nn_msg_init (&self->outmsg, 0);

    self->continuing = 0;

    memset (self->utf8_code_pt_fragment, 0,
        NN_SWS_UTF8_MAX_CODEPOINT_LEN);
    self->utf8_code_pt_fragment_len = 0;

    self->pings_sent = 0;
    self->pongs_sent = 0;
    self->pings_received = 0;
    self->pongs_received = 0;

    nn_fsm_event_init (&self->done);
}